

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void getText(QString *text,QTextDocumentPrivate *priv,QString *docText,int pos,int end)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  char16_t *pcVar4;
  long lVar5;
  int iVar6;
  long in_FS_OFFSET;
  long *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (; iVar6 = end - pos, iVar6 != 0 && pos <= end; pos = iVar3 + pos) {
    local_48 = (long *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocumentPrivate::find((QTextDocumentPrivate *)&local_48,(int)priv);
    lVar1 = *local_48;
    lVar5 = ((ulong)puStack_40 & 0xffffffff) * 0x20;
    iVar3 = QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)&local_48);
    uVar2 = pos - iVar3;
    if (pos - iVar3 < 1) {
      uVar2 = 0;
    }
    iVar3 = *(int *)(lVar1 + 0x14 + lVar5) - uVar2;
    if (iVar6 <= iVar3) {
      iVar3 = iVar6;
    }
    pcVar4 = (docText->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    QString::append((QChar *)text,
                    (longlong)(pcVar4 + (long)*(int *)(lVar1 + 0x18 + lVar5) + (ulong)uVar2));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void getText(QString &text, QTextDocumentPrivate *priv, const QString &docText, int pos, int end)
{
    while (pos < end) {
        QTextDocumentPrivate::FragmentIterator fragIt = priv->find(pos);
        const QTextFragmentData * const frag = fragIt.value();

        const int offsetInFragment = qMax(0, pos - fragIt.position());
        const int len = qMin(int(frag->size_array[0] - offsetInFragment), end - pos);

        text += QStringView(docText.constData() + frag->stringPosition + offsetInFragment, len);
        pos += len;
    }
}